

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

Dam_Man_t * Dam_ManAlloc(Gia_Man_t *pGia)

{
  Dam_Man_t *pDVar1;
  abctime aVar2;
  Vec_Int_t *pVVar3;
  Dam_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pDVar1 = (Dam_Man_t *)calloc(1,0x78);
  aVar2 = Abc_Clock();
  pDVar1->clkStart = aVar2;
  pVVar3 = Vec_IntAlloc(1000);
  pDVar1->vVisit = pVVar3;
  pDVar1->pGia = pGia;
  return pDVar1;
}

Assistant:

Dam_Man_t * Dam_ManAlloc( Gia_Man_t * pGia )
{
    Dam_Man_t * p;
    p = ABC_CALLOC( Dam_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->vVisit = Vec_IntAlloc( 1000 );
    p->pGia = pGia;
    return p;
}